

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O0

void __thiscall MyClientConnection::OnConnect(MyClientConnection *this)

{
  SDKResult SVar1;
  void *__src;
  long lVar2;
  string Hello;
  uint8_t hello [1401];
  uint64_t in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  SDKConnection *this_00;
  allocator local_5a9;
  SDKConnection local_5a8 [14];
  SDKConnection *in_stack_fffffffffffffd10;
  
  test::LogTonkStatus(in_stack_fffffffffffffd10);
  memset(&local_5a8[0].SelfReference,0,0x579);
  local_5a8[0].SelfReference.super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_1_ = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_5a8,"Hello World",&local_5a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  this_00 = local_5a8;
  __src = (void *)std::__cxx11::string::c_str();
  lVar2 = std::__cxx11::string::length();
  memcpy((void *)((long)&local_5a8[0].SelfReference.
                         super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 + 1),__src,lVar2 + 1);
  test::FunctionTimer::BeginCall
            ((FunctionTimer *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
  std::__cxx11::string::length();
  SVar1 = tonk::SDKConnection::Send
                    (this_00,(void *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                     in_stack_fffffffffffffa08,0);
  test::FunctionTimer::EndCall((FunctionTimer *)CONCAT44(SVar1.Result,in_stack_fffffffffffffa10));
  std::__cxx11::string::~string((string *)local_5a8);
  return;
}

Assistant:

void MyClientConnection::OnConnect()
{
    LogTonkStatus(this);

    uint8_t hello[1 + 1400] = {};
    hello[0] = ID_ConnectionRebroadcast;
    std::string Hello = "Hello World";
    memcpy(hello + 1, Hello.c_str(), Hello.length() + 1);
    t_tonk_send.BeginCall();
    Send(hello, 1 + Hello.length() + 1, TonkChannel_Reliable0);
    t_tonk_send.EndCall();
}